

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::MetaVariable::
set_value<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
          (MetaVariable *this,
          vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *v)

{
  string local_38 [32];
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *local_18;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *v_local;
  MetaVariable *this_local;
  
  local_18 = v;
  v_local = (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)this;
  tinyusdz::value::Value::operator=(&this->_value,v);
  ::std::__cxx11::string::string(local_38);
  ::std::__cxx11::string::operator=((string *)&this->_name,local_38);
  ::std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void set_value(const T &v) {
    // TODO: Check T is supported type for Metadatum.
    _value = v;

    _name = std::string();  // empty
  }